

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import-utils.h
# Opt level: O0

void __thiscall wasm::ImportInfo::ImportInfo(ImportInfo *this,Module *wasm)

{
  bool bVar1;
  pointer this_00;
  pointer this_01;
  pointer this_02;
  pointer this_03;
  pointer this_04;
  pointer local_f0;
  reference local_e8;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *import_4;
  iterator __end2_4;
  iterator __begin2_4;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *__range2_4;
  reference local_c0;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *import_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  *__range2_3;
  reference local_98;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *import_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *__range2_2;
  reference local_70;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2_1;
  reference local_38;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2;
  Module *wasm_local;
  ImportInfo *this_local;
  
  this->wasm = wasm;
  std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>::vector(&this->importedGlobals);
  std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector(&this->importedFunctions)
  ;
  std::vector<wasm::Table_*,_std::allocator<wasm::Table_*>_>::vector(&this->importedTables);
  std::vector<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>::vector(&this->importedMemories);
  std::vector<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>::vector(&this->importedTags);
  __end2 = std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::begin(&wasm->globals);
  import = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
           std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::end(&wasm->globals);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                     *)&import), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
               ::operator*(&__end2);
    this_00 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                        (local_38);
    bVar1 = Importable::imported(&this_00->super_Importable);
    if (bVar1) {
      __range2_1 = (vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    *)std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get
                                (local_38);
      std::vector<wasm::Global_*,_std::allocator<wasm::Global_*>_>::push_back
                (&this->importedGlobals,(value_type *)&__range2_1);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(&wasm->functions);
  import_1 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
             std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::end(&wasm->functions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                             *)&import_1), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end2_1);
    this_01 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                        (local_70);
    bVar1 = Importable::imported(&this_01->super_Importable);
    if (bVar1) {
      __range2_2 = (vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                    *)std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                (local_70);
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                (&this->importedFunctions,(value_type *)&__range2_2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::begin(&wasm->tables);
  import_2 = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
             std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::end(&wasm->tables);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                             *)&import_2), bVar1) {
    local_98 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
               ::operator*(&__end2_2);
    this_02 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(local_98);
    bVar1 = Importable::imported(&this_02->super_Importable);
    if (bVar1) {
      __range2_3 = (vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    *)std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::get(local_98)
      ;
      std::vector<wasm::Table_*,_std::allocator<wasm::Table_*>_>::push_back
                (&this->importedTables,(value_type *)&__range2_3);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
    ::operator++(&__end2_2);
  }
  __end2_3 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::begin(&wasm->memories);
  import_3 = (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
             std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::end(&wasm->memories);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_3,
                            (__normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
                             *)&import_3), bVar1) {
    local_c0 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
               ::operator*(&__end2_3);
    this_03 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                        (local_c0);
    bVar1 = Importable::imported(&this_03->super_Importable);
    if (bVar1) {
      __range2_4 = (vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                    *)std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::get
                                (local_c0);
      std::vector<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>::push_back
                (&this->importedMemories,(value_type *)&__range2_4);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
    ::operator++(&__end2_3);
  }
  __end2_4 = std::
             vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ::begin(&wasm->tags);
  import_4 = (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)
             std::
             vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ::end(&wasm->tags);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_4,
                            (__normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
                             *)&import_4), bVar1) {
    local_e8 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
               ::operator*(&__end2_4);
    this_04 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(local_e8);
    bVar1 = Importable::imported(&this_04->super_Importable);
    if (bVar1) {
      local_f0 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::get(local_e8);
      std::vector<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>::push_back
                (&this->importedTags,&local_f0);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
    ::operator++(&__end2_4);
  }
  return;
}

Assistant:

ImportInfo(Module& wasm) : wasm(wasm) {
    for (auto& import : wasm.globals) {
      if (import->imported()) {
        importedGlobals.push_back(import.get());
      }
    }
    for (auto& import : wasm.functions) {
      if (import->imported()) {
        importedFunctions.push_back(import.get());
      }
    }
    for (auto& import : wasm.tables) {
      if (import->imported()) {
        importedTables.push_back(import.get());
      }
    }
    for (auto& import : wasm.memories) {
      if (import->imported()) {
        importedMemories.push_back(import.get());
      }
    }
    for (auto& import : wasm.tags) {
      if (import->imported()) {
        importedTags.push_back(import.get());
      }
    }
  }